

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O3

void OpenMesh::IO::assignCustomProperty<unsigned_int>
               (istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar2;
  uint local_34;
  value_type local_30;
  BaseHandle local_2c;
  uint in;
  
  iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  local_34 = 0;
  local_2c.idx_ =
       (int)PropertyContainer::handle<unsigned_int>
                      ((PropertyContainer *)(CONCAT44(extraout_var,iVar1) + 8),&local_34,_propName);
  if (local_2c.idx_ == -1) {
    iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
    BaseKernel::add_property<unsigned_int>
              ((BaseKernel *)CONCAT44(extraout_var_00,iVar1),(VPropHandleT<unsigned_int> *)&local_2c
               ,_propName);
  }
  std::istream::_M_extract<unsigned_int>((uint *)_in);
  iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  pvVar2 = BaseKernel::property<unsigned_int>
                     ((BaseKernel *)CONCAT44(extraout_var_01,iVar1),
                      (VPropHandleT<unsigned_int>)local_2c.idx_,_vh);
  *pvVar2 = local_30;
  return;
}

Assistant:

void assignCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName)
{
  OpenMesh::VPropHandleT<T> prop;
  if (!_bi.kernel()->get_property_handle(prop,_propName))
    _bi.kernel()->add_property(prop,_propName);
  T in;
  _in >> in;
  _bi.kernel()->property(prop,_vh) = in;
}